

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  Twine *this;
  StringRef LHS;
  StringRef LHS_00;
  StringRef path_00;
  bool bVar1;
  reference pSVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined7 in_register_00000031;
  Style in_R8D;
  long lVar4;
  StringRef SVar5;
  StringRef path_01;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  undefined1 local_348 [8];
  SmallString<256U> result;
  SmallVector<llvm::StringRef,_16U> components;
  Child local_110;
  undefined8 uStack_108;
  Twine *local_100;
  char *pcStack_f8;
  size_t local_f0;
  undefined8 uStack_e8;
  Twine local_e0;
  Child local_c8;
  undefined8 uStack_c0;
  Twine *local_b8;
  char *pcStack_b0;
  size_t local_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  StringRef C_1;
  Child CStack_78;
  StringRef C;
  StringRef local_58;
  undefined4 local_44;
  size_t local_40;
  Style local_34;
  
  SVar5.Length._4_4_ = in_register_00000014;
  SVar5.Length._0_4_ = style;
  local_44 = (undefined4)CONCAT71(in_register_00000031,remove_dot_dot);
  local_58.Data =
       (char *)(path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  SVar5.Data = (char *)(ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
  ;
  result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       &components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       (void *)0x1000000000;
  local_58.Length = (size_t)SVar5.Data;
  local_34 = style;
  SVar5 = relative_path((path *)local_58.Data,SVar5,windows);
  path_01.Data = SVar5.Length;
  path_01.Length._0_4_ = local_34;
  path_01.Length._4_4_ = 0;
  local_40 = path_01.Data;
  begin((const_iterator *)&local_110,(path *)SVar5.Data,path_01,in_R8D);
  local_a8 = local_f0;
  uStack_a0 = uStack_e8;
  local_b8 = local_100;
  pcStack_b0 = pcStack_f8;
  local_c8 = local_110;
  uStack_c0 = uStack_108;
  do {
    if ((local_c8.twine == (Twine *)SVar5.Data) && (local_a8 == local_40)) {
      path_00.Length = local_58.Length;
      path_00.Data = local_58.Data;
      SVar5 = root_path(path_00,local_34);
      SmallVector<char,256u>::SmallVector<char_const*,void>
                ((SmallVector<char,256u> *)local_348,SVar5.Data,SVar5.Data + SVar5.Length);
      local_40._0_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xf8].buffer[0];
      local_40._1_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xf9].buffer[0];
      local_40._2_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xfa].buffer[0];
      local_40._3_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xfb].buffer[0];
      local_40._4_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xfc].buffer[0];
      local_40._5_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xfd].buffer[0];
      local_40._6_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xfe].buffer[0];
      local_40._7_1_ =
           result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
           [0xff].buffer[0];
      uVar3 = (ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX & 0xffffffff;
      this = (Twine *)(components.super_SmallVectorStorage<llvm::StringRef,_16U>.InlineElts[0xf].
                       buffer + 8);
      for (lVar4 = 0; uVar3 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
        auStack_98 = *(undefined1 (*) [8])(local_40 + lVar4);
        C_1.Data = (char *)((undefined8 *)(local_40 + lVar4))[1];
        Twine::Twine((Twine *)&local_c8,(StringRef *)auStack_98);
        Twine::Twine(&local_e0,"");
        Twine::Twine((Twine *)&CStack_78,"");
        Twine::Twine(this,"");
        append((SmallVectorImpl<char> *)local_348,local_34,(Twine *)&local_c8,&local_e0,
               (Twine *)&CStack_78,this);
      }
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::StringRef> *)
                 (result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                  InlineElts + 0xf8));
      bVar1 = SmallVectorImpl<char>::operator==((SmallVectorImpl<char> *)local_348,path);
      if (!bVar1) {
        SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_348);
      }
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_348);
      return !bVar1;
    }
    CStack_78.twine = local_b8;
    C.Data = pcStack_b0;
    LHS.Length = (size_t)pcStack_b0;
    LHS.Data = (char *)local_b8;
    RHS.Length = 1;
    RHS.Data = ".";
    bVar1 = llvm::operator==(LHS,RHS);
    if (!bVar1) {
      if ((char)local_44 != '\0') {
        LHS_00.Length = (size_t)C.Data;
        LHS_00.Data = CStack_78.cString;
        RHS_00.Length = 2;
        RHS_00.Data = "..";
        bVar1 = llvm::operator==(LHS_00,RHS_00);
        if (bVar1) {
          if ((int)components.super_SmallVectorImpl<llvm::StringRef>.
                   super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX != 0) {
            pSVar2 = SmallVectorTemplateCommon<llvm::StringRef,_void>::back
                               ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)
                                (result.super_SmallVector<char,_256U>.
                                 super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
            RHS_01.Length = 2;
            RHS_01.Data = "..";
            bVar1 = llvm::operator!=(*pSVar2,RHS_01);
            if (bVar1) {
              SmallVectorTemplateBase<llvm::StringRef,_true>::pop_back
                        ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
                         (result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                          InlineElts + 0xf8));
              goto LAB_00dbf1ac;
            }
          }
          Twine::Twine(&local_e0,&local_58);
          bVar1 = is_absolute(&local_e0,local_34);
          if (bVar1) goto LAB_00dbf1ac;
        }
      }
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
                 (result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                  InlineElts + 0xf8),(StringRef *)&CStack_78);
    }
LAB_00dbf1ac:
    const_iterator::operator++((const_iterator *)&local_c8);
  } while( true );
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}